

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O1

void __thiscall PA4Application::update(PA4Application *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  Program *pPVar3;
  double dVar4;
  string local_38;
  
  fVar2 = this->m_currentTime;
  dVar4 = glfwGetTime();
  this->m_currentTime = (float)dVar4;
  this->m_deltaTime = (float)dVar4 - fVar2;
  (**(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_OGLStateObject)._vptr_OGLStateObject)();
  pPVar3 = (this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"V","");
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(pPVar3,&local_38,&this->m_view);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pPVar3 = (this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"P","");
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(pPVar3,&local_38,&this->m_proj);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (*(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_OGLStateObject)._vptr_OGLStateObject[1])();
  continuousKey(this);
  return;
}

Assistant:

void PA4Application::update()
{
  float prevTime = m_currentTime;
  m_currentTime = glfwGetTime();
  m_deltaTime = m_currentTime - prevTime;

  m_program->bind();
  m_program->setUniform("V", m_view);
  m_program->setUniform("P", m_proj);
  m_program->unbind();

  continuousKey();
}